

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linenoise.c
# Opt level: O0

void linenoisePathCompletion(char *buf,char *hint,linenoiseCompletions *lc)

{
  int iVar1;
  char *pcVar2;
  size_t sVar3;
  DIR *__dirp;
  size_t __n;
  undefined1 local_10e8 [8];
  stat st;
  dirent *ent;
  DIR *dir;
  char match [4098];
  char *hint_ptr;
  char *full_path;
  char *ptr;
  linenoiseCompletions *lc_local;
  char *hint_local;
  char *buf_local;
  
  lc->path = 1;
  pcVar2 = strrchr(hint,0x2f);
  if (pcVar2 == (char *)0x0) {
    hint_ptr = (char *)malloc(0x1003);
    strcpy(hint_ptr,"./");
    full_path = hint;
  }
  else {
    hint_ptr = (char *)malloc((long)(((int)pcVar2 - (int)hint) + 0x1001));
    full_path = pcVar2 + 1;
    sprintf(hint_ptr,"%.*s",(ulong)(uint)((int)full_path - (int)hint),hint);
  }
  sVar3 = strlen(hint_ptr);
  __dirp = opendir(hint_ptr);
  if (__dirp == (DIR *)0x0) {
    free(hint_ptr);
  }
  else {
    while (st.__glibc_reserved[2] = (__syscall_slong_t)readdir(__dirp),
          (dirent *)st.__glibc_reserved[2] != (dirent *)0x0) {
      if (((dirent *)st.__glibc_reserved[2])->d_name[0] != '.') {
        pcVar2 = ((dirent *)st.__glibc_reserved[2])->d_name;
        __n = strlen(full_path);
        iVar1 = strncmp(full_path,pcVar2,__n);
        if (iVar1 == 0) {
          strcpy(hint_ptr + sVar3,(char *)(st.__glibc_reserved[2] + 0x13));
          iVar1 = stat(hint_ptr,(stat *)local_10e8);
          if (iVar1 == 0) {
            strcpy((char *)&dir,(char *)(st.__glibc_reserved[2] + 0x13));
            if (((uint)st.st_nlink & 0xf000) == 0x4000) {
              strcat((char *)&dir,"/");
            }
            linenoiseAddCompletion(lc,(char *)&dir);
          }
        }
      }
    }
    free(hint_ptr);
    closedir(__dirp);
  }
  return;
}

Assistant:

void linenoisePathCompletion(const char *buf, const char *hint, linenoiseCompletions *lc) {
    const char *ptr;
    char *full_path, *hint_ptr, match[FILENAME_MAX + 2];
    DIR *dir;
    struct dirent *ent;
    struct stat st;

    (void)buf;

    lc->path = 1;

    ptr = strrchr(hint, '/');

    /* new relative path */
    if (ptr == NULL) {
        full_path = malloc(2 + FILENAME_MAX + 1);
        strcpy(full_path, "./");

        ptr = hint;
    } else {
        full_path = malloc((int)(ptr - hint) + FILENAME_MAX + 1);
        ++ptr;
        sprintf(full_path, "%.*s", (int)(ptr - hint), hint);
    }
    hint_ptr = full_path + strlen(full_path);

    dir = opendir(full_path);
    if (dir == NULL) {
        free(full_path);
        return;
    }

    while ((ent = readdir(dir))) {
        if (ent->d_name[0] == '.') {
            continue;
        }

        if (!strncmp(ptr, ent->d_name, strlen(ptr))) {
            /* is it a directory? */
            strcpy(hint_ptr, ent->d_name);
            if (stat(full_path, &st)) {
                /* skip this item */
                continue;
            }

            strcpy(match, ent->d_name);
            if (S_ISDIR(st.st_mode)) {
                strcat(match, "/");
            }

            linenoiseAddCompletion(lc, match);
        }
    }

    free(full_path);
    closedir(dir);
}